

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O3

int Csw_CutFilter(Csw_Man_t *p,Aig_Obj_t *pObj,Csw_Cut_t *pCut)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Csw_Cut_t *pCVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int k;
  ulong uVar9;
  
  iVar3 = p->nCutsMax;
  if (0 < iVar3) {
    pCVar4 = p->pCuts[pObj->Id];
    iVar5 = 0;
    do {
      bVar1 = pCVar4->nFanins;
      if (pCVar4 != pCut && '\x01' < (char)bVar1) {
        bVar2 = pCut->nFanins;
        uVar6 = (ulong)bVar2;
        uVar8 = pCut->uSign & pCVar4->uSign;
        if ((char)bVar2 < (char)bVar1) {
          if (uVar8 == pCut->uSign) {
            if ('\0' < (char)bVar2) {
              uVar7 = 0;
              do {
                uVar9 = 0;
                while (*(int *)((long)&pCut[1].pNext + uVar7 * 4) !=
                       *(int *)((long)&pCVar4[1].pNext + uVar9 * 4)) {
                  uVar9 = uVar9 + 1;
                  if (bVar1 == uVar9) goto LAB_004effc7;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar6);
            }
            pCVar4->nFanins = '\0';
          }
        }
        else if (uVar8 == pCVar4->uSign) {
          uVar7 = 0;
          while( true ) {
            uVar9 = 0;
            while (*(int *)((long)&pCVar4[1].pNext + uVar7 * 4) !=
                   *(int *)((long)&pCut[1].pNext + uVar9 * 4)) {
              uVar9 = uVar9 + 1;
              if (uVar6 == uVar9) goto LAB_004effc7;
            }
            if (uVar6 == uVar9) break;
            uVar7 = uVar7 + 1;
            if (uVar7 == bVar1) {
              pCut->nFanins = '\0';
              return 1;
            }
          }
        }
      }
LAB_004effc7:
      iVar5 = iVar5 + 1;
      pCVar4 = (Csw_Cut_t *)((long)&pCVar4->pNext + (long)pCVar4->nCutSize);
    } while (iVar5 != iVar3);
  }
  return 0;
}

Assistant:

int Csw_CutFilter( Csw_Man_t * p, Aig_Obj_t * pObj, Csw_Cut_t * pCut )
{ 
    Csw_Cut_t * pTemp;
    int i;
    // go through the cuts of the node
    Csw_ObjForEachCut( p, pObj, pTemp, i )
    {
        if ( pTemp->nFanins < 2 )
            continue;
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nFanins > pCut->nFanins )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Csw_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->nFanins = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Csw_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given
                pCut->nFanins = 0;
                return 1;
            }
        }
    }
    return 0;
}